

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O3

void emit_asm(BuildCtx *ctx)

{
  byte bVar1;
  int iVar2;
  BuildMode BVar3;
  BuildSym *pBVar4;
  ulong uVar5;
  uint uVar6;
  uint n;
  uint n_00;
  uint extraout_EDX;
  int iVar7;
  char *pcVar8;
  uint8_t *p;
  char *__format;
  FILE *__stream;
  int *piVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  
  fprintf((FILE *)ctx->fp,"\t.file \"buildvm_%s.dasc\"\n",ctx->dasm_arch);
  fwrite("\t.text\n",7,1,(FILE *)ctx->fp);
  if ((ulong)ctx->mode < 3) {
    fprintf((FILE *)ctx->fp,&DAT_00113b68 + *(int *)(&DAT_00113b68 + (ulong)ctx->mode * 4),4);
  }
  emit_asm_label(ctx,ctx->beginsym,0,0);
  if (ctx->mode != BUILD_machasm) {
    fwrite(".Lbegin:\n",9,1,(FILE *)ctx->fp);
  }
  if (0 < ctx->nsym) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      pBVar4 = ctx->sym;
      iVar10 = pBVar4[lVar11].ofs;
      lVar12 = lVar11 + 1;
      iVar2 = pBVar4[lVar12].ofs;
      iVar7 = iVar2 - iVar10;
      emit_asm_label(ctx,pBVar4[lVar11].name,iVar7,1);
      if ((int)lVar14 < ctx->nreloc) {
        lVar14 = (long)(int)lVar14;
        piVar9 = &ctx->reloc[lVar14].type;
        do {
          iVar7 = ((BuildReloc *)(piVar9 + -2))->ofs;
          if (iVar2 < iVar7) break;
          n = iVar7 - iVar10;
          p = (uint8_t *)(long)iVar10;
          if ((*piVar9 == 0) || ((ctx->mode & ~BUILD_machasm) != BUILD_elfasm)) {
            emit_asm_bytes(ctx,p + (long)ctx->code,n);
            iVar10 = *piVar9;
            pcVar13 = ctx->relocsym[piVar9[-1]];
            if (ctx->mode == BUILD_coffasm) {
              fprintf((FILE *)ctx->fp,"\t.def %s; .scl 3; .type 32; .endef\n",pcVar13);
LAB_0010aad9:
              __stream = (FILE *)ctx->fp;
              if (iVar10 == 0) goto LAB_0010aaea;
              pcVar8 = "\t.long %s-.-4\n";
            }
            else {
              if (ctx->mode == BUILD_elfasm) goto LAB_0010aad9;
              __stream = (FILE *)ctx->fp;
LAB_0010aaea:
              pcVar8 = "\t.long %s\n";
            }
            fprintf(__stream,pcVar8,pcVar13);
          }
          else {
            pcVar13 = ctx->relocsym[piVar9[-1]];
            uVar6 = piVar9[-1];
            if ((int)n < 1) {
LAB_0010ac5e:
              emit_asm_cold_1();
              iVar10 = *(int *)(pcVar13 + 8);
              if (iVar10 == 2) {
                fprintf(*(FILE **)(pcVar13 + 0x10),
                        "\n\t.private_extern %s\n\t.no_dead_strip %s\n%s:\n",p,p,p);
                return;
              }
              if (iVar10 == 1) {
                fprintf(*(FILE **)(pcVar13 + 0x10),"\n\t.globl %s\n",p);
                if (uVar6 != 0) {
                  fprintf(*(FILE **)(pcVar13 + 0x10),"\t.def %s; .scl 3; .type 32; .endef\n",p);
                }
                fprintf(*(FILE **)(pcVar13 + 0x10),"%s:\n",p);
                return;
              }
              if (iVar10 == 0) {
                pcVar8 = "function";
                if (uVar6 == 0) {
                  pcVar8 = "object";
                }
                fprintf(*(FILE **)(pcVar13 + 0x10),
                        "\n\t.globl %s\n\t.hidden %s\n\t.type %s, @%s\n\t.size %s, %d\n%s:\n",p,p,p,
                        pcVar8,p,(ulong)extraout_EDX,p);
              }
              return;
            }
            p = p + (long)ctx->code;
            n_00 = n - 1;
            bVar1 = p[n_00];
            uVar6 = (uint)bVar1;
            if (bVar1 == 0xe8) {
              pcVar8 = "call";
            }
            else if (bVar1 == 0xe9) {
              pcVar8 = "jmp";
            }
            else {
              if ((((-1 < (char)bVar1) || (n == 1)) || (0x8f < bVar1)) ||
                 (uVar6 = (uint)bVar1, p[(ulong)n - 2] != '\x0f')) goto LAB_0010ac5e;
              pcVar8 = jccnames_rel + *(int *)(jccnames_rel + (ulong)(bVar1 & 0x7f) * 4);
              n_00 = n - 2;
            }
            emit_asm_bytes(ctx,p,n_00);
            uVar5 = (ulong)(*pcVar13 == '_');
            if ((((pcVar13[uVar5] == 'l') && (pcVar13[uVar5 + 1] == 'j')) &&
                (pcVar13[uVar5 + 2] == '_')) ||
               (__format = "\t%s %s@PLT\n", ctx->mode != BUILD_elfasm)) {
              __format = "\t%s %s\n";
            }
            fprintf((FILE *)ctx->fp,__format,pcVar8,pcVar13);
          }
          iVar10 = iVar7 + 4;
          lVar14 = lVar14 + 1;
          piVar9 = piVar9 + 3;
        } while (lVar14 < ctx->nreloc);
        iVar7 = iVar2 - iVar10;
      }
      emit_asm_bytes(ctx,ctx->code + iVar10,iVar7);
      lVar11 = lVar12;
    } while (lVar12 < ctx->nsym);
  }
  fputc(10,(FILE *)ctx->fp);
  BVar3 = ctx->mode;
  if (BVar3 == BUILD_machasm) {
    pcVar13 = "\t.cstring\n\t.ascii \"%s\\0\"\n";
  }
  else {
    pcVar13 = "\t.ident \"%s\"\n";
    if (BVar3 != BUILD_coffasm) {
      if (BVar3 != BUILD_elfasm) goto LAB_0010ac42;
      fwrite("\t.section .note.GNU-stack,\"\",@progbits\n",0x27,1,(FILE *)ctx->fp);
    }
  }
  fprintf((FILE *)ctx->fp,pcVar13,ctx->dasm_ident);
LAB_0010ac42:
  fputc(10,(FILE *)ctx->fp);
  return;
}

Assistant:

void emit_asm(BuildCtx *ctx)
{
  int i, rel;

  fprintf(ctx->fp, "\t.file \"buildvm_%s.dasc\"\n", ctx->dasm_arch);
#if LJ_ARCH_PPC_ELFV2
  fprintf(ctx->fp, "\t.abiversion 2\n");
#endif
  fprintf(ctx->fp, "\t.text\n");
  emit_asm_align(ctx, 4);

#if LJ_TARGET_PS3
  emit_asm_label(ctx, ctx->beginsym, ctx->codesz, 0);
#else
  emit_asm_label(ctx, ctx->beginsym, 0, 0);
#endif
  if (ctx->mode != BUILD_machasm)
    fprintf(ctx->fp, ".Lbegin:\n");

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  /* This should really be moved into buildvm_arm.dasc. */
#if LJ_ARCH_HASFPU
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".vsave {d8-d15}\n"
	  ".save {r4}\n"
	  ".pad #28\n");
#else
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r4, r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".pad #28\n");
#endif
#endif
#if LJ_TARGET_MIPS
  fprintf(ctx->fp, ".set nomips16\n.abicalls\n.set noreorder\n.set nomacro\n");
#endif

  for (i = rel = 0; i < ctx->nsym; i++) {
    int32_t ofs = ctx->sym[i].ofs;
    int32_t next = ctx->sym[i+1].ofs;
#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND && LJ_HASFFI
    if (!strcmp(ctx->sym[i].name, "lj_vm_ffi_call"))
      fprintf(ctx->fp,
	      ".globl lj_err_unwind_arm\n"
	      ".personality lj_err_unwind_arm\n"
	      ".fnend\n"
	      ".fnstart\n"
	      ".save {r4, r5, r11, lr}\n"
	      ".setfp r11, sp\n");
#endif
    emit_asm_label(ctx, ctx->sym[i].name, next - ofs, 1);
    while (rel < ctx->nreloc && ctx->reloc[rel].ofs <= next) {
      BuildReloc *r = &ctx->reloc[rel];
      int n = r->ofs - ofs;
#if LJ_TARGET_X86ORX64
      if (r->type != 0 &&
	  (ctx->mode == BUILD_elfasm || ctx->mode == BUILD_machasm)) {
	emit_asm_reloc_text(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      } else {
	emit_asm_bytes(ctx, ctx->code+ofs, n);
	emit_asm_reloc(ctx, r->type, ctx->relocsym[r->sym]);
      }
      ofs += n+4;
#elif LJ_TARGET_S390X
      emit_asm_reloc_text(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      ofs += n+4;
#else
      emit_asm_wordreloc(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      ofs += n;
#endif
      rel++;
    }
#if LJ_TARGET_X86ORX64
    emit_asm_bytes(ctx, ctx->code+ofs, next-ofs);
#elif LJ_TARGET_S390X
    emit_asm_halfwords(ctx, ctx->code+ofs, next-ofs);
#else
    emit_asm_words(ctx, ctx->code+ofs, next-ofs);
#endif
  }

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  fprintf(ctx->fp,
#if !LJ_HASFFI
	  ".globl lj_err_unwind_arm\n"
	  ".personality lj_err_unwind_arm\n"
#endif
	  ".fnend\n");
#endif

  fprintf(ctx->fp, "\n");
  switch (ctx->mode) {
  case BUILD_elfasm:
#if !(LJ_TARGET_PS3 || LJ_TARGET_PSVITA)
    fprintf(ctx->fp, "\t.section .note.GNU-stack,\"\"," ELFASM_PX "progbits\n");
#endif
#if LJ_TARGET_PPC && !LJ_TARGET_PS3 && !LJ_ABI_SOFTFP
    /* Hard-float ABI. */
    fprintf(ctx->fp, "\t.gnu_attribute 4, 1\n");
#endif
    /* fallthrough */
  case BUILD_coffasm:
    fprintf(ctx->fp, "\t.ident \"%s\"\n", ctx->dasm_ident);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp,
      "\t.cstring\n"
      "\t.ascii \"%s\\0\"\n", ctx->dasm_ident);
    break;
  default:
    break;
  }
  fprintf(ctx->fp, "\n");
}